

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ModuleCloner.h
# Opt level: O0

int __thiscall
soul::ModuleCloner::clone
          (ModuleCloner *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  Module *pMVar1;
  bool bVar2;
  int iVar3;
  vector<soul::pool_ref<soul::heart::InputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::InputDeclaration>_>_>
  *this_00;
  InputDeclaration *__fn_00;
  undefined4 extraout_var;
  vector<soul::pool_ref<soul::heart::OutputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::OutputDeclaration>_>_>
  *this_01;
  OutputDeclaration *__fn_01;
  undefined4 extraout_var_00;
  vector<soul::pool_ref<soul::heart::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::heart::ProcessorInstance>_>_>
  *this_02;
  ProcessorInstance *__fn_02;
  undefined4 extraout_var_01;
  vector<soul::pool_ref<soul::heart::Connection>,_std::allocator<soul::pool_ref<soul::heart::Connection>_>_>
  *this_03;
  pool_ref *ppVar4;
  Connection *__fn_03;
  undefined4 extraout_var_02;
  pool_ref<soul::heart::Variable> *ppVar5;
  Variable *pVVar6;
  size_t sVar7;
  Function *__fn_04;
  Function *__child_stack_00;
  Function *pFVar8;
  void *__child_stack_01;
  void *__child_stack_02;
  void *__child_stack_03;
  void *__child_stack_04;
  ulong local_f8;
  size_t i;
  pool_ref<soul::heart::Variable> *v;
  pool_ref<soul::heart::Variable> *__end2_2;
  pool_ref<soul::heart::Variable> *__begin2_2;
  ArrayView<soul::pool_ref<soul::heart::Variable>_> *local_c8;
  ArrayView<soul::pool_ref<soul::heart::Variable>_> *__range2_2;
  pool_ref *local_b8;
  pool_ref<soul::heart::Connection> *c;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  vector<soul::pool_ref<soul::heart::Connection>,_std::allocator<soul::pool_ref<soul::heart::Connection>_>_>
  *__range3_1;
  pool_ref *local_90;
  pool_ref<soul::heart::ProcessorInstance> *mi;
  const_iterator __end3;
  const_iterator __begin3;
  vector<soul::pool_ref<soul::heart::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::heart::ProcessorInstance>_>_>
  *__range3;
  pool_ref *local_68;
  pool_ref<soul::heart::OutputDeclaration> *io_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<soul::pool_ref<soul::heart::OutputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::OutputDeclaration>_>_>
  *__range2_1;
  pool_ref<soul::heart::InputDeclaration> local_38;
  pool_ref *local_30;
  pool_ref<soul::heart::InputDeclaration> *io;
  const_iterator __end2;
  const_iterator __begin2;
  vector<soul::pool_ref<soul::heart::InputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::InputDeclaration>_>_>
  *__range2;
  ModuleCloner *this_local;
  
  this_00 = &this->oldModule->inputs;
  __end2 = std::
           vector<soul::pool_ref<soul::heart::InputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::InputDeclaration>_>_>
           ::begin(this_00);
  io = (pool_ref<soul::heart::InputDeclaration> *)
       std::
       vector<soul::pool_ref<soul::heart::InputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::InputDeclaration>_>_>
       ::end(this_00);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_soul::pool_ref<soul::heart::InputDeclaration>_*,_std::vector<soul::pool_ref<soul::heart::InputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::InputDeclaration>_>_>_>
                                     *)&io), bVar2) {
    ppVar4 = (pool_ref *)
             __gnu_cxx::
             __normal_iterator<const_soul::pool_ref<soul::heart::InputDeclaration>_*,_std::vector<soul::pool_ref<soul::heart::InputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::InputDeclaration>_>_>_>
             ::operator*(&__end2);
    pMVar1 = this->newModule;
    local_30 = ppVar4;
    __fn_00 = pool_ref::operator_cast_to_InputDeclaration_(ppVar4);
    iVar3 = clone(this,(__fn *)__fn_00,__child_stack_01,(int)ppVar4,__arg);
    pool_ref<soul::heart::InputDeclaration>::pool_ref<soul::heart::InputDeclaration,void>
              (&local_38,(InputDeclaration *)CONCAT44(extraout_var,iVar3));
    std::
    vector<soul::pool_ref<soul::heart::InputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::InputDeclaration>_>_>
    ::push_back(&pMVar1->inputs,&local_38);
    pool_ref<soul::heart::InputDeclaration>::~pool_ref(&local_38);
    __gnu_cxx::
    __normal_iterator<const_soul::pool_ref<soul::heart::InputDeclaration>_*,_std::vector<soul::pool_ref<soul::heart::InputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::InputDeclaration>_>_>_>
    ::operator++(&__end2);
  }
  this_01 = &this->oldModule->outputs;
  __end2_1 = std::
             vector<soul::pool_ref<soul::heart::OutputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::OutputDeclaration>_>_>
             ::begin(this_01);
  io_1 = (pool_ref<soul::heart::OutputDeclaration> *)
         std::
         vector<soul::pool_ref<soul::heart::OutputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::OutputDeclaration>_>_>
         ::end(this_01);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end2_1,
                            (__normal_iterator<const_soul::pool_ref<soul::heart::OutputDeclaration>_*,_std::vector<soul::pool_ref<soul::heart::OutputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::OutputDeclaration>_>_>_>
                             *)&io_1), bVar2) {
    ppVar4 = (pool_ref *)
             __gnu_cxx::
             __normal_iterator<const_soul::pool_ref<soul::heart::OutputDeclaration>_*,_std::vector<soul::pool_ref<soul::heart::OutputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::OutputDeclaration>_>_>_>
             ::operator*(&__end2_1);
    pMVar1 = this->newModule;
    local_68 = ppVar4;
    __fn_01 = pool_ref::operator_cast_to_OutputDeclaration_(ppVar4);
    iVar3 = clone(this,(__fn *)__fn_01,__child_stack_02,(int)ppVar4,__arg);
    pool_ref<soul::heart::OutputDeclaration>::pool_ref<soul::heart::OutputDeclaration,void>
              ((pool_ref<soul::heart::OutputDeclaration> *)&__range3,
               (OutputDeclaration *)CONCAT44(extraout_var_00,iVar3));
    std::
    vector<soul::pool_ref<soul::heart::OutputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::OutputDeclaration>_>_>
    ::push_back(&pMVar1->outputs,(pool_ref<soul::heart::OutputDeclaration> *)&__range3);
    pool_ref<soul::heart::OutputDeclaration>::~pool_ref
              ((pool_ref<soul::heart::OutputDeclaration> *)&__range3);
    __gnu_cxx::
    __normal_iterator<const_soul::pool_ref<soul::heart::OutputDeclaration>_*,_std::vector<soul::pool_ref<soul::heart::OutputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::OutputDeclaration>_>_>_>
    ::operator++(&__end2_1);
  }
  bVar2 = Module::isGraph(this->oldModule);
  if (bVar2) {
    this_02 = &this->oldModule->processorInstances;
    __end3 = std::
             vector<soul::pool_ref<soul::heart::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::heart::ProcessorInstance>_>_>
             ::begin(this_02);
    mi = (pool_ref<soul::heart::ProcessorInstance> *)
         std::
         vector<soul::pool_ref<soul::heart::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::heart::ProcessorInstance>_>_>
         ::end(this_02);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<const_soul::pool_ref<soul::heart::ProcessorInstance>_*,_std::vector<soul::pool_ref<soul::heart::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::heart::ProcessorInstance>_>_>_>
                                       *)&mi), bVar2) {
      ppVar4 = (pool_ref *)
               __gnu_cxx::
               __normal_iterator<const_soul::pool_ref<soul::heart::ProcessorInstance>_*,_std::vector<soul::pool_ref<soul::heart::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::heart::ProcessorInstance>_>_>_>
               ::operator*(&__end3);
      pMVar1 = this->newModule;
      local_90 = ppVar4;
      __fn_02 = pool_ref::operator_cast_to_ProcessorInstance_(ppVar4);
      iVar3 = clone(this,(__fn *)__fn_02,__child_stack_03,(int)ppVar4,__arg);
      pool_ref<soul::heart::ProcessorInstance>::pool_ref<soul::heart::ProcessorInstance,void>
                ((pool_ref<soul::heart::ProcessorInstance> *)&__range3_1,
                 (ProcessorInstance *)CONCAT44(extraout_var_01,iVar3));
      std::
      vector<soul::pool_ref<soul::heart::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::heart::ProcessorInstance>_>_>
      ::push_back(&pMVar1->processorInstances,
                  (pool_ref<soul::heart::ProcessorInstance> *)&__range3_1);
      pool_ref<soul::heart::ProcessorInstance>::~pool_ref
                ((pool_ref<soul::heart::ProcessorInstance> *)&__range3_1);
      __gnu_cxx::
      __normal_iterator<const_soul::pool_ref<soul::heart::ProcessorInstance>_*,_std::vector<soul::pool_ref<soul::heart::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::heart::ProcessorInstance>_>_>_>
      ::operator++(&__end3);
    }
    this_03 = &this->oldModule->connections;
    __end3_1 = std::
               vector<soul::pool_ref<soul::heart::Connection>,_std::allocator<soul::pool_ref<soul::heart::Connection>_>_>
               ::begin(this_03);
    c = (pool_ref<soul::heart::Connection> *)
        std::
        vector<soul::pool_ref<soul::heart::Connection>,_std::allocator<soul::pool_ref<soul::heart::Connection>_>_>
        ::end(this_03);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end3_1,
                              (__normal_iterator<const_soul::pool_ref<soul::heart::Connection>_*,_std::vector<soul::pool_ref<soul::heart::Connection>,_std::allocator<soul::pool_ref<soul::heart::Connection>_>_>_>
                               *)&c), bVar2) {
      ppVar4 = (pool_ref *)
               __gnu_cxx::
               __normal_iterator<const_soul::pool_ref<soul::heart::Connection>_*,_std::vector<soul::pool_ref<soul::heart::Connection>,_std::allocator<soul::pool_ref<soul::heart::Connection>_>_>_>
               ::operator*(&__end3_1);
      pMVar1 = this->newModule;
      local_b8 = ppVar4;
      __fn_03 = pool_ref::operator_cast_to_Connection_(ppVar4);
      iVar3 = clone(this,(__fn *)__fn_03,__child_stack_04,(int)ppVar4,__arg);
      pool_ref<soul::heart::Connection>::pool_ref<soul::heart::Connection,void>
                ((pool_ref<soul::heart::Connection> *)&__range2_2,
                 (Connection *)CONCAT44(extraout_var_02,iVar3));
      std::
      vector<soul::pool_ref<soul::heart::Connection>,_std::allocator<soul::pool_ref<soul::heart::Connection>_>_>
      ::push_back(&pMVar1->connections,(pool_ref<soul::heart::Connection> *)&__range2_2);
      pool_ref<soul::heart::Connection>::~pool_ref((pool_ref<soul::heart::Connection> *)&__range2_2)
      ;
      __gnu_cxx::
      __normal_iterator<const_soul::pool_ref<soul::heart::Connection>_*,_std::vector<soul::pool_ref<soul::heart::Connection>,_std::allocator<soul::pool_ref<soul::heart::Connection>_>_>_>
      ::operator++(&__end3_1);
    }
  }
  ___begin2_2 = Module::StateVariables::get(&this->oldModule->stateVariables);
  local_c8 = (ArrayView<soul::pool_ref<soul::heart::Variable>_> *)&__begin2_2;
  __end2_2 = ArrayView<soul::pool_ref<soul::heart::Variable>_>::begin(local_c8);
  ppVar5 = ArrayView<soul::pool_ref<soul::heart::Variable>_>::end(local_c8);
  for (; __end2_2 != ppVar5; __end2_2 = __end2_2 + 1) {
    pMVar1 = this->newModule;
    pVVar6 = pool_ref::operator_cast_to_Variable_((pool_ref *)__end2_2);
    pVVar6 = getRemappedVariable(this,pVVar6);
    Module::StateVariables::add(&pMVar1->stateVariables,pVVar6);
  }
  for (local_f8 = 0; sVar7 = Module::Functions::size(&this->oldModule->functions), local_f8 < sVar7;
      local_f8 = local_f8 + 1) {
    __fn_04 = Module::Functions::at(&this->newModule->functions,local_f8);
    pFVar8 = __fn_04;
    __child_stack_00 = Module::Functions::at(&this->oldModule->functions,local_f8);
    clone(this,(__fn *)__fn_04,__child_stack_00,(int)pFVar8,__arg);
  }
  pMVar1 = this->newModule;
  pMVar1->latency = this->oldModule->latency;
  return (int)pMVar1;
}

Assistant:

void clone()
    {
        for (auto& io : oldModule.inputs)
            newModule.inputs.push_back (clone (io));

        for (auto& io : oldModule.outputs)
            newModule.outputs.push_back (clone (io));

        if (oldModule.isGraph())
        {
            for (auto& mi : oldModule.processorInstances)
                newModule.processorInstances.push_back (clone (mi));

            for (auto& c : oldModule.connections)
                newModule.connections.push_back (clone (c));
        }

        for (auto& v : oldModule.stateVariables.get())
            newModule.stateVariables.add (getRemappedVariable (v));

        for (size_t i = 0; i <  oldModule.functions.size(); ++i)
            clone (newModule.functions.at (i), oldModule.functions.at (i));

        newModule.latency = oldModule.latency;
    }